

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * __thiscall CLI::Formatter::make_usage(Formatter *this,App *app,string *name)

{
  __normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
  __first;
  bool bVar1;
  function<bool_(const_CLI::App_*)> *filter;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> *__a;
  string *in_RCX;
  App *in_RDX;
  char *pcVar3;
  string *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  positional_names;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> positionals;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> non_pos_options;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groups;
  stringstream out;
  string usage;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *in_stack_fffffffffffffac8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffad0;
  anon_class_1_0_00000001 *in_stack_fffffffffffffad8;
  char *in_stack_fffffffffffffae0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffae8;
  __normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
  in_stack_fffffffffffffaf0;
  undefined7 in_stack_fffffffffffffaf8;
  undefined1 in_stack_fffffffffffffaff;
  undefined1 uVar4;
  allocator<char> *in_stack_fffffffffffffb00;
  char *in_stack_fffffffffffffb08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb10;
  App *in_stack_fffffffffffffb38;
  App *in_stack_fffffffffffffb48;
  App *this_01;
  allocator<char> local_411 [33];
  string local_3f0 [96];
  function<bool_(const_CLI::Option_*)> *in_stack_fffffffffffffc70;
  App *in_stack_fffffffffffffc78;
  string local_368 [8];
  string *in_stack_fffffffffffffca0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffca8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_319 [65];
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> local_2d8;
  allocator<char> local_2b9 [33];
  string local_298 [127];
  allocator<char> local_219 [33];
  string local_1f8 [32];
  stringstream local_1d8 [16];
  undefined4 local_50;
  App *local_18;
  
  local_18 = in_RDX;
  App::get_usage_abi_cxx11_(in_stack_fffffffffffffb38);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x18e7c4);
  if (bVar1) {
    ::std::__cxx11::stringstream::stringstream(local_1d8);
    this_01 = (App *)&stack0xfffffffffffffe38;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
    FormatterBase::get_label
              ((FormatterBase *)CONCAT17(in_stack_fffffffffffffaff,in_stack_fffffffffffffaf8),
               (string *)in_stack_fffffffffffffaf0._M_current);
    filter = (function<bool_(const_CLI::App_*)> *)::std::operator<<((ostream *)this_01,local_1f8);
    poVar2 = ::std::operator<<((ostream *)filter,":");
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x18e8ca
                      );
    pcVar3 = ",\t ";
    if (bVar1) {
      pcVar3 = "\t\t";
    }
    poVar2 = ::std::operator<<(poVar2,pcVar3 + 2);
    ::std::operator<<(poVar2,in_RCX);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffad0);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffad0);
    ::std::allocator<char>::~allocator(local_219);
    App::get_groups_abi_cxx11_(in_stack_fffffffffffffb48);
    ::std::function<bool(CLI::Option_const*)>::
    function<CLI::Formatter::make_usage(CLI::App_const*,std::__cxx11::string)const::_lambda(CLI::Option_const*)_1_,void>
              ((function<bool_(const_CLI::Option_*)> *)in_stack_fffffffffffffae0,
               in_stack_fffffffffffffad8);
    App::get_options(in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
    std::function<bool_(const_CLI::Option_*)>::~function
              ((function<bool_(const_CLI::Option_*)> *)0x18e9a5);
    bVar1 = std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::empty
                      ((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)
                       in_stack_fffffffffffffae0);
    if (!bVar1) {
      poVar2 = ::std::operator<<((ostream *)&stack0xfffffffffffffe38," [");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
      FormatterBase::get_label
                ((FormatterBase *)CONCAT17(in_stack_fffffffffffffaff,in_stack_fffffffffffffaf8),
                 (string *)in_stack_fffffffffffffaf0._M_current);
      poVar2 = ::std::operator<<(poVar2,local_298);
      ::std::operator<<(poVar2,"]");
      ::std::__cxx11::string::~string(in_stack_fffffffffffffad0);
      ::std::__cxx11::string::~string(in_stack_fffffffffffffad0);
      ::std::allocator<char>::~allocator(local_2b9);
    }
    ::std::function<bool(CLI::Option_const*)>::
    function<CLI::Formatter::make_usage(CLI::App_const*,std::__cxx11::string)const::_lambda(CLI::Option_const*)_2_,void>
              ((function<bool_(const_CLI::Option_*)> *)in_stack_fffffffffffffae0,
               in_stack_fffffffffffffad8);
    App::get_options(in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
    std::function<bool_(const_CLI::Option_*)>::~function
              ((function<bool_(const_CLI::Option_*)> *)0x18ec14);
    bVar1 = std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::empty
                      ((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)
                       in_stack_fffffffffffffae0);
    if (!bVar1) {
      std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::size(&local_2d8);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x18ec53);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffaf0._M_current,
               (size_type)in_stack_fffffffffffffae8._M_current,
               (allocator_type *)in_stack_fffffffffffffae0);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(local_319);
      std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::begin
                (in_stack_fffffffffffffac8);
      std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::end
                (in_stack_fffffffffffffac8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffac8);
      __first._M_current._7_1_ = in_stack_fffffffffffffaff;
      __first._M_current._0_7_ = in_stack_fffffffffffffaf8;
      ::std::
      transform<__gnu_cxx::__normal_iterator<CLI::Option_const**,std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,CLI::Formatter::make_usage(CLI::App_const*,std::__cxx11::string)const::_lambda(CLI::Option_const*)_3_>
                (__first,in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
                 (anon_class_8_1_8991fb9c)in_stack_fffffffffffffae0);
      poVar2 = ::std::operator<<((ostream *)&stack0xfffffffffffffe38," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
      CLI::detail::join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
      ::std::operator<<(poVar2,local_368);
      ::std::__cxx11::string::~string(in_stack_fffffffffffffad0);
      ::std::__cxx11::string::~string(in_stack_fffffffffffffad0);
      ::std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffc77);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffae0);
    }
    ::std::function<bool(CLI::App_const*)>::
    function<CLI::Formatter::make_usage(CLI::App_const*,std::__cxx11::string)const::_lambda(CLI::App_const*)_1_,void>
              ((function<bool_(const_CLI::App_*)> *)in_stack_fffffffffffffae0,
               in_stack_fffffffffffffad8);
    App::get_subcommands(this_01,filter);
    bVar1 = std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::empty
                      ((vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *)
                       in_stack_fffffffffffffae0);
    std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::~vector
              ((vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *)
               in_stack_fffffffffffffae0);
    std::function<bool_(const_CLI::App_*)>::~function((function<bool_(const_CLI::App_*)> *)0x18ef14)
    ;
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      poVar2 = ::std::operator<<((ostream *)&stack0xfffffffffffffe38," ");
      this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                App::get_require_subcommand_min(local_18);
      pcVar3 = "";
      if (this_00 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "[";
      }
      poVar2 = ::std::operator<<(poVar2,pcVar3);
      __a = (allocator<char> *)App::get_require_subcommand_max(local_18);
      uVar4 = true;
      if ((allocator<char> *)0x1 < __a) {
        in_stack_fffffffffffffaf0._M_current = (Option **)App::get_require_subcommand_min(local_18);
        uVar4 = (string *)0x1 < in_stack_fffffffffffffaf0._M_current;
      }
      in_stack_fffffffffffffae0 = "SUBCOMMANDS";
      if ((bool)uVar4 != false) {
        in_stack_fffffffffffffae0 = "SUBCOMMAND";
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)poVar2,__a);
      FormatterBase::get_label
                ((FormatterBase *)CONCAT17(uVar4,in_stack_fffffffffffffaf8),
                 (string *)in_stack_fffffffffffffaf0._M_current);
      poVar2 = ::std::operator<<(poVar2,local_3f0);
      in_stack_fffffffffffffad0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           App::get_require_subcommand_min(local_18);
      pcVar3 = "";
      if (in_stack_fffffffffffffad0 ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "]";
      }
      ::std::operator<<(poVar2,pcVar3);
      ::std::__cxx11::string::~string(in_stack_fffffffffffffad0);
      ::std::__cxx11::string::~string(in_stack_fffffffffffffad0);
      ::std::allocator<char>::~allocator(local_411);
    }
    ::std::operator<<((ostream *)&stack0xfffffffffffffe38,'\n');
    ::std::__cxx11::stringstream::str();
    local_50 = 1;
    std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::~vector
              ((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)
               in_stack_fffffffffffffae0);
    std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::~vector
              ((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)
               in_stack_fffffffffffffae0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffae0);
    ::std::__cxx11::stringstream::~stringstream(local_1d8);
  }
  else {
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffaff,in_stack_fffffffffffffaf8),
                     (char *)in_stack_fffffffffffffaf0._M_current);
    local_50 = 1;
  }
  ::std::__cxx11::string::~string(in_stack_fffffffffffffad0);
  return in_RDI;
}

Assistant:

CLI11_INLINE std::string Formatter::make_usage(const App *app, std::string name) const {
    std::string usage = app->get_usage();
    if(!usage.empty()) {
        return usage + "\n";
    }

    std::stringstream out;

    out << get_label("Usage") << ":" << (name.empty() ? "" : " ") << name;

    std::vector<std::string> groups = app->get_groups();

    // Print an Options badge if any options exist
    std::vector<const Option *> non_pos_options =
        app->get_options([](const Option *opt) { return opt->nonpositional(); });
    if(!non_pos_options.empty())
        out << " [" << get_label("OPTIONS") << "]";

    // Positionals need to be listed here
    std::vector<const Option *> positionals = app->get_options([](const Option *opt) { return opt->get_positional(); });

    // Print out positionals if any are left
    if(!positionals.empty()) {
        // Convert to help names
        std::vector<std::string> positional_names(positionals.size());
        std::transform(positionals.begin(), positionals.end(), positional_names.begin(), [this](const Option *opt) {
            return make_option_usage(opt);
        });

        out << " " << detail::join(positional_names, " ");
    }

    // Add a marker if subcommands are expected or optional
    if(!app->get_subcommands(
               [](const CLI::App *subc) { return ((!subc->get_disabled()) && (!subc->get_name().empty())); })
            .empty()) {
        out << " " << (app->get_require_subcommand_min() == 0 ? "[" : "")
            << get_label(app->get_require_subcommand_max() < 2 || app->get_require_subcommand_min() > 1 ? "SUBCOMMAND"
                                                                                                        : "SUBCOMMANDS")
            << (app->get_require_subcommand_min() == 0 ? "]" : "");
    }

    out << '\n';

    return out.str();
}